

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

cmSourceGroup * __thiscall cmSourceGroup::operator=(cmSourceGroup *this,cmSourceGroup *r)

{
  std::__cxx11::string::_M_assign((string *)this);
  cmsys::RegularExpression::operator=(&this->GroupRegex,&r->GroupRegex);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->GroupFiles)._M_t,&(r->GroupFiles)._M_t);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::operator=
            (&this->SourceFiles,&r->SourceFiles);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::operator=
            (&((this->Internal)._M_t.
               super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
               .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl)->GroupChildren,
             &((r->Internal)._M_t.
               super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
               .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl)->GroupChildren)
  ;
  return this;
}

Assistant:

cmSourceGroup& cmSourceGroup::operator=(cmSourceGroup const& r)
{
  this->Name = r.Name;
  this->GroupRegex = r.GroupRegex;
  this->GroupFiles = r.GroupFiles;
  this->SourceFiles = r.SourceFiles;
  *(this->Internal) = *(r.Internal);
  return *this;
}